

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O3

int __thiscall Spc_Dsp::init(Spc_Dsp *this,EVP_PKEY_CTX *ctx)

{
  sample_t_conflict1 *psVar1;
  int extraout_EAX;
  
  (this->m).ram = (uint8_t *)ctx;
  mute_voices(this,0);
  (this->m).surround_threshold = -0x4000;
  psVar1 = (this->m).extra;
  (this->m).out_begin = psVar1;
  (this->m).out = psVar1;
  (this->m).out_end = (sample_t_conflict1 *)(this + 1);
  load(this,initial_regs);
  return extraout_EAX;
}

Assistant:

void Spc_Dsp::init( void* ram_64k )
{
	m.ram = (uint8_t*) ram_64k;
	mute_voices( 0 );
	disable_surround( false );
	set_output( 0, 0 );
	reset();
	
	#ifndef NDEBUG
		// be sure this sign-extends
		assert( (int16_t) 0x8000 == -0x8000 );
		
		// be sure right shift preserves sign
		assert( (-1 >> 1) == -1 );
		
		// check clamp macro
		int i;
		i = +0x8000; CLAMP16( i ); assert( i == +0x7FFF );
		i = -0x8001; CLAMP16( i ); assert( i == -0x8000 );
		
		blargg_verify_byte_order();
	#endif
}